

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

DdNode * extraZddGetSingletons(DdManager *dd,DdNode *bVars)

{
  DdNode *P;
  DdNode *Q;
  DdNode *zPlus;
  DdNode *zTemp;
  DdNode *zRes;
  DdNode *bVars_local;
  DdManager *dd_local;
  
  if (bVars == dd->one) {
    dd_local = (DdManager *)dd->one;
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup1Zdd(dd,extraZddGetSingletons,bVars);
    if (dd_local == (DdManager *)0x0) {
      P = extraZddGetSingletons(dd,(bVars->type).kids.T);
      if (P == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)P & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)P & 0xfffffffffffffffe) + 4) + 1;
        Q = cuddZddGetNode(dd,bVars->index << 1,dd->one,dd->zero);
        if (Q == (DdNode *)0x0) {
          Cudd_RecursiveDerefZdd(dd,P);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)Q & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)Q & 0xfffffffffffffffe) + 4) + 1;
          dd_local = (DdManager *)cuddZddUnion(dd,P,Q);
          if (dd_local == (DdManager *)0x0) {
            Cudd_RecursiveDerefZdd(dd,P);
            Cudd_RecursiveDerefZdd(dd,Q);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDerefZdd(dd,P);
            Cudd_RecursiveDerefZdd(dd,Q);
            *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
            cuddCacheInsert1(dd,extraZddGetSingletons,bVars,(DdNode *)dd_local);
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * extraZddGetSingletons( 
  DdManager * dd,    /* the DD manager */
  DdNode * bVars)    /* the set of variables */
{
    DdNode * zRes;

    if ( bVars == b1 )
//    if ( bVars == b0 )  // bug fixed by Jin Zhang, Jan 23, 2004
        return z1;

    if ( (zRes = cuddCacheLookup1Zdd(dd, extraZddGetSingletons, bVars)) )
        return zRes;
    else
    {
        DdNode * zTemp, * zPlus;          

        // solve subproblem
        zRes = extraZddGetSingletons( dd, cuddT(bVars) );
        if ( zRes == NULL ) 
            return NULL;
        cuddRef( zRes );
        
        zPlus = cuddZddGetNode( dd, 2*bVars->index, z1, z0 );
        if ( zPlus == NULL ) 
        {
            Cudd_RecursiveDerefZdd( dd, zRes );
            return NULL;
        }
        cuddRef( zPlus );

        // add these to the result
        zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
        if ( zRes == NULL )
        {
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
            return NULL;
        }
        cuddRef( zRes );
        Cudd_RecursiveDerefZdd( dd, zTemp );
        Cudd_RecursiveDerefZdd( dd, zPlus );
        cuddDeref( zRes );

        cuddCacheInsert1( dd, extraZddGetSingletons, bVars, zRes );
        return zRes;
    }
}